

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O1

RegSlot __thiscall FuncInfo::AcquireTmpRegister(FuncInfo *this)

{
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  if (this->firstTmpReg == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xfc,"(this->firstTmpReg != Js::Constants::NoRegister)",
                       "this->firstTmpReg != Js::Constants::NoRegister");
    if (!bVar3) goto LAB_008ada2c;
    *puVar4 = 0;
  }
  if ((this->varRegsCount < this->curTmpReg) || (this->curTmpReg < this->firstTmpReg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xfe,
                       "(this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg)"
                       ,
                       "this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg"
                      );
    if (!bVar3) {
LAB_008ada2c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  RVar1 = this->curTmpReg;
  uVar5 = RVar1 + 1;
  this->curTmpReg = uVar5;
  if (uVar5 != 0) {
    if (this->varRegsCount < uVar5) {
      this->varRegsCount = uVar5;
    }
    return RVar1;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::RegSlot FuncInfo::AcquireTmpRegister()
{
    Assert(this->firstTmpReg != Js::Constants::NoRegister);
    // Allocate a new temp pseudo-register, increasing the locals count if necessary.
    Assert(this->curTmpReg <= this->varRegsCount && this->curTmpReg >= this->firstTmpReg);
    Js::RegSlot tmpReg = this->curTmpReg;
    UInt32Math::Inc(this->curTmpReg);
    if (this->curTmpReg > this->varRegsCount)
    {
        this->varRegsCount = this->curTmpReg;
    }
    return tmpReg;
}